

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool IsValidSubDFace(ON_SubDFace *face,unsigned_short level,uint *face_id_range,
                    unsigned_short ordinary_face_edge_count,bool bSilentError)

{
  bool bVar1;
  uint uVar2;
  ON_Internal_DamagedMarker local_38;
  ON_Internal_DamagedMarker dm;
  bool bSilentError_local;
  unsigned_short ordinary_face_edge_count_local;
  uint *face_id_range_local;
  unsigned_short level_local;
  ON_SubDFace *face_local;
  
  dm.m_subd_component._5_1_ = bSilentError;
  dm.m_subd_component._6_2_ = ordinary_face_edge_count;
  if (face == (ON_SubDFace *)0x0) {
    face_local._7_1_ = ON_SubDIsNotValid(bSilentError);
  }
  else {
    uVar2 = ON_SubDComponentBase::SubdivisionLevel(&face->super_ON_SubDComponentBase);
    if (uVar2 == level) {
      if (face_id_range != (uint *)0x0) {
        if ((face->super_ON_SubDComponentBase).m_id < *face_id_range) {
          bVar1 = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          return bVar1;
        }
        if (face_id_range[1] < (face->super_ON_SubDComponentBase).m_id) {
          bVar1 = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
          return bVar1;
        }
      }
      ON_Internal_DamagedMarker::ON_Internal_DamagedMarker
                (&local_38,&face->super_ON_SubDComponentBase);
      if (face->m_edge_count < 3) {
        face_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
      }
      else if ((face->m_edge_count < 5) || (face->m_edgex != (ON_SubDEdgePtr *)0x0)) {
        if ((level == 0) || (dm.m_subd_component._6_2_ == face->m_edge_count)) {
          ON_Internal_DamagedMarker::ClearComponent(&local_38);
          face_local._7_1_ = true;
        }
        else {
          face_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
        }
      }
      else {
        face_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
      }
      ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker(&local_38);
    }
    else {
      face_local._7_1_ = ON_SubDIsNotValid((bool)(dm.m_subd_component._5_1_ & 1));
    }
  }
  return face_local._7_1_;
}

Assistant:

static bool IsValidSubDFace(
  const ON_SubDFace* face,
  unsigned short level,
  unsigned int* face_id_range,
  unsigned short ordinary_face_edge_count,
  bool bSilentError
  )
{
  if (nullptr == face)
    return ON_SubDIsNotValid(bSilentError);

  if (face->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr != face_id_range)
  {
    if (face->m_id < face_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (face->m_id > face_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(face);

  if (face->m_edge_count < 3)
    return ON_SubDIsNotValid(bSilentError);

  if (face->m_edge_count > 4 && nullptr == face->m_edgex)
    return ON_SubDIsNotValid(bSilentError);

  if (level > 0 && ordinary_face_edge_count != face->m_edge_count)
    return ON_SubDIsNotValid(bSilentError);

  dm.ClearComponent();

  return true;
}